

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::anon_unknown_14::XmlReporter::log_assert(XmlReporter *this,AssertData *rb)

{
  XmlWriter *this_00;
  Enum EVar1;
  char *pcVar2;
  String *pSVar3;
  allocator<char> local_cd;
  allocator<char> local_cc;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  undefined1 local_c8 [32];
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  uint local_24;
  
  if ((rb->m_failed != false) || (this->opt->success == true)) {
    std::mutex::lock(&this->mutex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_c8 + 0x40),"Expression",&local_c9);
    this_00 = &this->xml;
    XmlWriter::startElement(this_00,(string *)(local_c8 + 0x40));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_c8 + 0x20),"success",&local_ca);
    XmlWriter::writeAttribute(this_00,(string *)(local_c8 + 0x20),(bool)(rb->m_failed ^ 1));
    std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"type",&local_cb);
    pcVar2 = assertString(rb->m_at);
    XmlWriter::writeAttribute(this_00,(string *)local_c8,pcVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"filename",&local_cc);
    pcVar2 = skipPathFromFilename(rb->m_file);
    XmlWriter::writeAttribute(this_00,&local_48,pcVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"line",&local_cd);
    local_24 = 0;
    if (this->opt->no_line_numbers == false) {
      local_24 = rb->m_line;
    }
    XmlWriter::writeAttribute<unsigned_int>(this_00,&local_68,&local_24);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)(local_c8 + 0x20));
    std::__cxx11::string::~string((string *)(local_c8 + 0x40));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_c8 + 0x40),"Original",(allocator<char> *)&local_48);
    XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_c8 + 0x20),rb->m_expr,(allocator<char> *)&local_68);
    XmlWriter::ScopedElement::writeText((ScopedElement *)local_c8,(string *)(local_c8 + 0x20),true);
    std::__cxx11::string::~string((string *)(local_c8 + 0x20));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
    std::__cxx11::string::~string((string *)(local_c8 + 0x40));
    if (rb->m_threw == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_c8 + 0x40),"Exception",(allocator<char> *)&local_48);
      XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)this_00);
      if ((rb->m_exception).field_0.buf[0x17] < '\0') {
        pSVar3 = (String *)(rb->m_exception).field_0.data.ptr;
      }
      else {
        pSVar3 = &rb->m_exception;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_c8 + 0x20),(char *)pSVar3,(allocator<char> *)&local_68);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)local_c8,(string *)(local_c8 + 0x20),true);
      std::__cxx11::string::~string((string *)(local_c8 + 0x20));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
      std::__cxx11::string::~string((string *)(local_c8 + 0x40));
    }
    EVar1 = rb->m_at;
    if ((EVar1 & is_throws_as) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_c8 + 0x40),"ExpectedException",(allocator<char> *)&local_48);
      XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)this_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_c8 + 0x20),rb->m_exception_type,(allocator<char> *)&local_68);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)local_c8,(string *)(local_c8 + 0x20),true);
      std::__cxx11::string::~string((string *)(local_c8 + 0x20));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
      std::__cxx11::string::~string((string *)(local_c8 + 0x40));
      EVar1 = rb->m_at;
    }
    if ((EVar1 & is_throws_with) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_c8 + 0x40),"ExpectedExceptionString",(allocator<char> *)&local_48)
      ;
      XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)this_00);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_c8 + 0x20),rb->m_exception_string,(allocator<char> *)&local_68);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)local_c8,(string *)(local_c8 + 0x20),true);
      std::__cxx11::string::~string((string *)(local_c8 + 0x20));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
      std::__cxx11::string::~string((string *)(local_c8 + 0x40));
      EVar1 = rb->m_at;
    }
    if (((EVar1 & is_normal) != 0) && (rb->m_threw == false)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_c8 + 0x40),"Expanded",(allocator<char> *)&local_48);
      XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)this_00);
      if ((rb->m_decomp).field_0.buf[0x17] < '\0') {
        pSVar3 = (String *)(rb->m_decomp).field_0.data.ptr;
      }
      else {
        pSVar3 = &rb->m_decomp;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_c8 + 0x20),(char *)pSVar3,(allocator<char> *)&local_68);
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)local_c8,(string *)(local_c8 + 0x20),true);
      std::__cxx11::string::~string((string *)(local_c8 + 0x20));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
      std::__cxx11::string::~string((string *)(local_c8 + 0x40));
    }
    log_contexts(this);
    XmlWriter::endElement(this_00);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if(!rb.m_failed && !opt.success)
                return;

            std::lock_guard<std::mutex> lock(mutex);

            xml.startElement("Expression")
                    .writeAttribute("success", !rb.m_failed)
                    .writeAttribute("type", assertString(rb.m_at))
                    .writeAttribute("filename", skipPathFromFilename(rb.m_file))
                    .writeAttribute("line", line(rb.m_line));

            xml.scopedElement("Original").writeText(rb.m_expr);

            if(rb.m_threw)
                xml.scopedElement("Exception").writeText(rb.m_exception.c_str());

            if(rb.m_at & assertType::is_throws_as)
                xml.scopedElement("ExpectedException").writeText(rb.m_exception_type);
            if(rb.m_at & assertType::is_throws_with)
                xml.scopedElement("ExpectedExceptionString").writeText(rb.m_exception_string);
            if((rb.m_at & assertType::is_normal) && !rb.m_threw)
                xml.scopedElement("Expanded").writeText(rb.m_decomp.c_str());

            log_contexts();

            xml.endElement();
        }